

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# follyqueue.cpp
# Opt level: O0

int read_proc(void)

{
  bool bVar1;
  int number;
  ProducerConsumerQueue<int> *in_stack_00000020;
  int *in_stack_00000040;
  ProducerConsumerQueue<int> *in_stack_00000048;
  
  while (result <= g_maxCount) {
    bVar1 = folly::ProducerConsumerQueue<int>::isEmpty(in_stack_00000020);
    if (bVar1) {
      usleep(1);
    }
    else {
      folly::ProducerConsumerQueue<int>::try_dequeue(in_stack_00000048,in_stack_00000040);
      result = 0;
    }
  }
  g_running = false;
  return 0;
}

Assistant:

int read_proc()
{
	int number = 0 ; 
	// You can also peek at the front item of the queue (consumer only)
	while(result <= g_maxCount)
	{
		//int* front = q.peek();
		if (!q.isEmpty())
		{
			result = q.try_dequeue(number); 
			if (result)
			{
				Log("result is "<< result << " num is " << number ); 
				result = number; 
			}
			else 
			{
				Log("dequeue failed"); 

			}
		}
		else 
		{
			usleep(1); 
		}
	}

	g_running = false; 
	Log(" read finished " ); ; 
	return 0; 
}